

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
::emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
          (QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
           *this,pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *key,
          pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *args)

{
  long lVar1;
  bool bVar2;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *in_RDX;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *in_RDI;
  long in_FS_OFFSET;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  copy;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *in_stack_ffffffffffffff98;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *in_stack_ffffffffffffffa0;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *in_stack_ffffffffffffffa8;
  piter local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::isDetached(in_stack_ffffffffffffffa0);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
            ::shouldGrow((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
                          *)in_RDI->first);
    if (bVar2) {
      local_30 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>
                                  (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
    else {
      local_30 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                                  (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
    ::QHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
    ::detach(in_stack_ffffffffffffffa0);
    local_30 = (piter)emplace_helper<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>const&>
                                (in_RDX,in_RDI,in_stack_ffffffffffffffa8);
    QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
    ::~QHash(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_30;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }